

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mklev.c
# Opt level: O0

void makerooms(level *lev,int levstyle)

{
  byte bVar1;
  bool bVar2;
  boolean bVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  nhrect *pnVar8;
  bool bVar9;
  bool bVar10;
  int local_30;
  int local_2c;
  int y;
  int x;
  int room_height;
  int room_width;
  int grid_height;
  int grid_width;
  boolean did_splitrm;
  boolean do_splitrm;
  boolean tried_vault;
  int levstyle_local;
  level *lev_local;
  
  if (levstyle == 4) {
    iVar4 = rn2(3);
    iVar5 = rn2(4);
    iVar6 = 3;
    if (iVar5 != 0) {
      iVar6 = 2;
    }
    iVar5 = (int)(0x50 / (long)((iVar4 + 5) * 2));
    iVar7 = 2;
    if (iVar6 == 2) {
      iVar7 = 4;
    }
    for (local_2c = 0; local_2c < iVar4 + 4; local_2c = local_2c + 1) {
      for (local_30 = 0; local_30 < iVar6; local_30 = local_30 + 1) {
        smeq[lev->nroom] = lev->nroom;
        add_room(lev,(local_2c * 2 + 1) * iVar5 + local_2c * 2,
                 (local_30 * 2 + 1) * iVar7 + local_30 * 2,(local_2c * 2 + 2) * iVar5 + local_2c * 2
                 ,(local_30 * 2 + 2) * iVar7 + local_30 * 2,'\x01','\0','\0');
      }
    }
  }
  else {
    bVar2 = false;
    iVar4 = rn2(10);
    bVar9 = iVar4 == 0;
    bVar1 = 0;
    do {
      while( true ) {
        while( true ) {
          bVar10 = false;
          if (lev->nroom < 0x28) {
            pnVar8 = rnd_rect();
            bVar10 = pnVar8 != (nhrect *)0x0;
          }
          if (!bVar10) {
            return;
          }
          if ((((int)(lev->nroom - (uint)bVar1) < 6) || (iVar4 = rn2(2), iVar4 == 0)) || (bVar2))
          break;
          bVar2 = true;
          bVar3 = create_room(lev,-1,-1,'\x02','\x02',-1,-1,'\x04','\x01');
          if (bVar3 != '\0') {
            vault_x = lev->rooms[lev->nroom].lx;
            vault_y = lev->rooms[lev->nroom].ly;
            lev->rooms[lev->nroom].hx = -1;
          }
        }
        if (((!bVar9) || (0x27 < lev->nroom + 1)) || (bVar3 = mk_split_room(lev), bVar3 == '\0'))
        break;
        bVar9 = false;
        bVar1 = 1;
      }
      bVar3 = create_room(lev,-1,-1,-1,-1,-1,-1,'\0',-1);
    } while (bVar3 != '\0');
  }
  return;
}

Assistant:

static void makerooms(struct level *lev, int levstyle)
{
	boolean tried_vault, do_splitrm, did_splitrm;

	/*
	 * It's worth noting that some level styles have particular weaknesses.
	 * For example, LEVSTYLE_RING has no shops since all rooms have 2 doors,
	 * and LEVSTYLE_GRID leaves no room for vaults or split rooms.
	 */

	if (levstyle == LEVSTYLE_GRID) {
	    int grid_width = rn1(3, 4);
	    int grid_height = rn2(4) ? 2 : 3;
	    int room_width = COLNO / ((grid_width + 1) * 2);
	    int room_height = (grid_height == 2) ? 4 : 2;
	    int x, y;

	    /* make grid rooms in column-major order */
	    for (x = 0; x < grid_width; x++) {
		for (y = 0; y < grid_height; y++) {
		    /*
		     * create_room() does not handle the regular grid pattern well;
		     * the room position parameter is not precise enough.
		     * So we'll do it the old-fashioned way.
		     */
		    smeq[lev->nroom] = lev->nroom;
		    add_room(lev,
			     (2 * x + 1) * room_width + 2 * x,
			     (2 * y + 1) * room_height + 2 * y,
			     (2 * x + 2) * room_width + 2 * x,
			     (2 * y + 2) * room_height + 2 * y,
			     TRUE, OROOM, FALSE);
		}
	    }

	    /* No room for a vault.  Don't bother trying. */
	    return;
	}

	/* make rooms until satisfied */
	tried_vault = FALSE;
	do_splitrm = !rn2(10);
	did_splitrm = FALSE;
	/* rnd_rect() will returns 0 if no more rects are available... */
	while (lev->nroom < MAXNROFROOMS && rnd_rect()) {
		/* don't double-count split room halves when limiting room count */
		if (lev->nroom - (did_splitrm ? 1 : 0) >= MAXNROFROOMS / 6 &&
		    rn2(2) && !tried_vault) {
			tried_vault = TRUE;
			if (create_vault(lev)) {
				vault_x = lev->rooms[lev->nroom].lx;
				vault_y = lev->rooms[lev->nroom].ly;
				lev->rooms[lev->nroom].hx = -1;
			}
		} else {
		    if (do_splitrm && lev->nroom + 1 < MAXNROFROOMS) {
			if (mk_split_room(lev)) {
			    do_splitrm = FALSE;
			    did_splitrm = TRUE;
			    continue;
			}
		    }
		    if (!create_room(lev, -1, -1, -1, -1, -1, -1, OROOM, -1))
			return;
		}
	}
	return;
}